

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3DbIsNamed(sqlite3 *db,int iDb,char *zName)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    bVar1 = db->aDb[iDb].zDbSName[lVar4];
    bVar2 = zName[lVar4];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar4 = lVar4 + 1;
  } while( true );
  iVar3 = 1;
  if ((bVar1 == bVar2) || (iVar3 = 0, iDb != 0)) {
    return iVar3;
  }
  lVar4 = 0;
  do {
    bVar1 = "main"[lVar4];
    bVar2 = zName[lVar4];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_00151715;
    }
    else if (""[bVar1] != ""[bVar2]) {
LAB_00151715:
      return (int)(bVar1 == bVar2);
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3DbIsNamed(sqlite3 *db, int iDb, const char *zName){
  return (
      sqlite3StrICmp(db->aDb[iDb].zDbSName, zName)==0
   || (iDb==0 && sqlite3StrICmp("main", zName)==0)
  );
}